

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest5::testDraw
          (FunctionalTest5 *this,GLuint *subroutine_combination,vec4<float> *input_data,
          vec4<float> *out_first_routine_result,vec4<float> *out_second_routine_result,
          vec4<float> *out_third_routine_result,vec4<unsigned_int> *out_fourth_routine_result)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  float *pfVar4;
  long lVar5;
  GLuint subroutine_indices [4];
  GLuint local_48 [6];
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  lVar5 = 0;
  do {
    local_48[this->m_subroutine_uniform_locations[lVar5][0]] =
         this->m_subroutine_indices[lVar5][subroutine_combination[lVar5]];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  (**(code **)(lVar3 + 0x1668))(0x8b31,4,local_48);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x103b);
  lVar5 = 0;
  do {
    (**(code **)(lVar3 + 0x15a0))
              ((&input_data->m_x)[lVar5],(&input_data->m_y)[lVar5],(&input_data->m_z)[lVar5],
               (&input_data->m_w)[lVar5],*(undefined4 *)((long)this->m_uniform_locations + lVar5));
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Uniform4f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1042);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  (**(code **)(lVar3 + 0x30))(0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1047);
  (**(code **)(lVar3 + 0x538))(0,0,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x104a);
  (**(code **)(lVar3 + 0x638))();
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x104d);
  pfVar4 = (float *)(**(code **)(lVar3 + 0xcf8))(0x8c8e,35000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1051);
  out_first_routine_result->m_x = *pfVar4;
  out_first_routine_result->m_y = pfVar4[1];
  out_first_routine_result->m_z = pfVar4[2];
  out_first_routine_result->m_w = pfVar4[3];
  out_second_routine_result->m_x = pfVar4[4];
  out_second_routine_result->m_y = pfVar4[5];
  out_second_routine_result->m_z = pfVar4[6];
  out_second_routine_result->m_w = pfVar4[7];
  out_third_routine_result->m_x = pfVar4[8];
  out_third_routine_result->m_y = pfVar4[9];
  out_third_routine_result->m_z = pfVar4[10];
  out_third_routine_result->m_w = pfVar4[0xb];
  out_fourth_routine_result->m_x = (uint)pfVar4[0xc];
  out_fourth_routine_result->m_y = (uint)pfVar4[0xd];
  out_fourth_routine_result->m_z = (uint)pfVar4[0xe];
  out_fourth_routine_result->m_w = (uint)pfVar4[0xf];
  (**(code **)(lVar3 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x106f);
  return;
}

Assistant:

void FunctionalTest5::testDraw(const glw::GLuint			   subroutine_combination[4],
							   const Utils::vec4<glw::GLfloat> input_data[3],
							   Utils::vec4<glw::GLfloat>&	  out_first_routine_result,
							   Utils::vec4<glw::GLfloat>&	  out_second_routine_result,
							   Utils::vec4<glw::GLfloat>&	  out_third_routine_result,
							   Utils::vec4<glw::GLuint>&	   out_fourth_routine_result) const
{
	static const GLuint   n_uniforms = sizeof(m_uniform_locations) / sizeof(m_uniform_locations[0]);
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();
	GLuint				  subroutine_indices[4];
	static const GLuint   n_subroutine_uniforms = sizeof(subroutine_indices) / sizeof(subroutine_indices[0]);

	/* Prepare subroutine uniform data */
	for (GLuint i = 0; i < n_subroutine_uniforms; ++i)
	{
		const GLuint location = m_subroutine_uniform_locations[i][0];

		subroutine_indices[location] = m_subroutine_indices[i][subroutine_combination[i]];
	}

	/* Set up subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, n_subroutine_uniforms, &subroutine_indices[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Set up input data uniforms */
	for (GLuint i = 0; i < n_uniforms; ++i)
	{
		gl.uniform4f(m_uniform_locations[i], input_data[i].m_x, input_data[i].m_y, input_data[i].m_z,
					 input_data[i].m_w);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");
	}

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Capture results */
	GLvoid* feedback_data = gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	GLfloat* float_ptr = (GLfloat*)feedback_data;

	/* First result */
	out_first_routine_result.m_x = float_ptr[0];
	out_first_routine_result.m_y = float_ptr[1];
	out_first_routine_result.m_z = float_ptr[2];
	out_first_routine_result.m_w = float_ptr[3];

	/* Second result */
	out_second_routine_result.m_x = float_ptr[4];
	out_second_routine_result.m_y = float_ptr[5];
	out_second_routine_result.m_z = float_ptr[6];
	out_second_routine_result.m_w = float_ptr[7];

	/* Third result */
	out_third_routine_result.m_x = float_ptr[8];
	out_third_routine_result.m_y = float_ptr[9];
	out_third_routine_result.m_z = float_ptr[10];
	out_third_routine_result.m_w = float_ptr[11];

	/* Fourth result */
	GLuint* uint_ptr			  = (GLuint*)(float_ptr + 12);
	out_fourth_routine_result.m_x = uint_ptr[0];
	out_fourth_routine_result.m_y = uint_ptr[1];
	out_fourth_routine_result.m_z = uint_ptr[2];
	out_fourth_routine_result.m_w = uint_ptr[3];

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");
}